

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::compute_quant_table(jpeg_encoder *this,int32 *pDst,int16 *pSrc)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = (this->m_params).m_quality;
  if (iVar1 < 0x32) {
    iVar1 = (int)(5000 / (long)iVar1);
  }
  else {
    iVar1 = iVar1 * -2 + 200;
  }
  lVar4 = 0;
  do {
    uVar3 = SUB168(SEXT816((long)pSrc[lVar4] * (long)iVar1 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8)
            + (long)pSrc[lVar4] * (long)iVar1 + 0x32;
    iVar2 = (int)(uVar3 >> 6) - (int)((long)uVar3 >> 0x3f);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    if (0xfe < iVar2) {
      iVar2 = 0xff;
    }
    pDst[lVar4] = iVar2;
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 0x40);
  return;
}

Assistant:

void jpeg_encoder::compute_quant_table(int32* pDst, int16* pSrc)
	{
		int32 q;
		if (m_params.m_quality < 50)
			q = 5000 / m_params.m_quality;
		else
			q = 200 - m_params.m_quality * 2;
		for (int i = 0; i < 64; i++)
		{
			int32 j = *pSrc++; j = (j * q + 50L) / 100L;
			*pDst++ = JPGE_MIN(JPGE_MAX(j, 1), 255);
		}
	}